

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

LinTerms * __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::SplitLinTerms(LinTerms *__return_storage_ptr__,
               Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *this,LinTerms *ltin,LinTerms *lt_out_vars)

{
  double c;
  int v;
  ptr piVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  LinTerms *this_00;
  _Invoker_type *this_01;
  size_t i;
  ulong uVar5;
  long lVar6;
  _Vector_base<int,_std::allocator<int>_> local_58;
  ptr local_40;
  size_ty local_38;
  
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data
             .m_storage;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  piVar1 = (ltin->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  local_38 = (ltin->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = &this[-8].MarkVarIfLogical_._M_invoker;
  lVar4 = local_38 << 2;
  uVar3 = 0;
  local_40 = piVar1;
  for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 4) {
    bVar2 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)this_01,
                       *(int *)((long)piVar1 + lVar6));
    uVar3 = uVar3 + bVar2;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  LinTerms::reserve(lt_out_vars,(ulong)uVar3);
  LinTerms::reserve(__return_storage_ptr__,
                    (ltin->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_size - (ulong)uVar3);
  for (uVar5 = 0;
      uVar5 < (ltin->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_size; uVar5 = uVar5 + 1) {
    c = (ltin->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar5];
    if ((c != 0.0) || (NAN(c))) {
      v = (ltin->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar5];
      bVar2 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                        ((FlatModel<mp::DefaultFlatModelParams> *)this_01,v);
      this_00 = lt_out_vars;
      if (!bVar2) {
        this_00 = __return_storage_ptr__;
      }
      LinTerms::add_term(this_00,c,v);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

LinTerms SplitLinTerms(const LinTerms& ltin, LinTerms& lt_out_vars) {
    LinTerms result;
    int nvars=0;
    for (int v: ltin.vars())
      if (MPCD( IsProperVar(v) ))
        ++nvars;
    lt_out_vars.reserve(nvars);
    result.reserve(ltin.size() - nvars);
    int v=0;
    double c=0.0;
    for (size_t i=0; i<ltin.size(); ++i) {
      if ((c = ltin.coef(i))) {                       // non-0
        if (MPCD( IsProperVar(v = ltin.var(i)) )) {
          lt_out_vars.add_term(c, v);
        } else {
          result.add_term(c, v);
        }
      }
    }
    return result;
  }